

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

QDomDocumentPrivate * __thiscall QDomNodePrivate::ownerDocument(QDomNodePrivate *this)

{
  QDomNodePrivate *pQVar1;
  int iVar2;
  
  while( true ) {
    iVar2 = (*(((QDomDocumentPrivate *)this)->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])
                      (this);
    if (iVar2 == 9) {
      return (QDomDocumentPrivate *)this;
    }
    pQVar1 = &((QDomDocumentPrivate *)this)->super_QDomNodePrivate;
    this = (((QDomDocumentPrivate *)this)->super_QDomNodePrivate).ownerNode;
    if ((pQVar1->field_0x98 & 2) == 0) break;
    if ((QDomDocumentPrivate *)this == (QDomDocumentPrivate *)0x0) {
      return (QDomDocumentPrivate *)0x0;
    }
  }
  return (QDomDocumentPrivate *)this;
}

Assistant:

QDomDocumentPrivate* QDomNodePrivate::ownerDocument()
{
    QDomNodePrivate* p = this;
    while (p && !p->isDocument()) {
        if (!p->hasParent)
            return static_cast<QDomDocumentPrivate *>(p->ownerNode);
        p = p->parent();
    }

    return static_cast<QDomDocumentPrivate *>(p);
}